

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void CoreML::downgradeSpecificationVersion(Model *pModel)

{
  uint32 uVar1;
  bool bVar2;
  Pipeline *this;
  Type *pModel_00;
  TypeUnion *pTVar3;
  int index;
  SupportVectorClassifier *pSVar4;
  
  if (pModel == (Model *)0x0) {
    return;
  }
  if (pModel->specificationversion_ == 0 || 5 < pModel->specificationversion_) {
    pModel->specificationversion_ = 5;
  }
  if ((pModel->specificationversion_ == 5) && (bVar2 = hasIOS14Features(pModel), !bVar2)) {
    pModel->specificationversion_ = 4;
  }
  if ((pModel->specificationversion_ == 4) && (bVar2 = hasIOS13Features(pModel), !bVar2)) {
    pModel->specificationversion_ = 3;
  }
  if ((pModel->specificationversion_ == 3) && (bVar2 = hasIOS12Features(pModel), !bVar2)) {
    pModel->specificationversion_ = 2;
  }
  if ((pModel->specificationversion_ == 2) && (bVar2 = hasIOS11_2Features(pModel), !bVar2)) {
    pModel->specificationversion_ = 1;
  }
  uVar1 = pModel->_oneof_case_[0];
  if (uVar1 == 200) {
    pTVar3 = (TypeUnion *)&((pModel->Type_).pipelineclassifier_)->pipeline_;
    if (((pModel->Type_).pipelineclassifier_)->pipeline_ == (Pipeline *)0x0) {
      this = (Pipeline *)operator_new(0x48);
      Specification::Pipeline::Pipeline(this);
LAB_0026bfe4:
      pTVar3->pipeline_ = this;
    }
  }
  else if (uVar1 == 0xc9) {
    pTVar3 = (TypeUnion *)&((pModel->Type_).pipelineclassifier_)->pipeline_;
    if (((pModel->Type_).pipelineclassifier_)->pipeline_ == (Pipeline *)0x0) {
      this = (Pipeline *)operator_new(0x48);
      Specification::Pipeline::Pipeline(this);
      goto LAB_0026bfe4;
    }
  }
  else {
    if (uVar1 != 0xca) {
      pSVar4 = (SupportVectorClassifier *)0x0;
      goto LAB_0026bfef;
    }
    pTVar3 = &pModel->Type_;
  }
  pSVar4 = pTVar3->supportvectorclassifier_;
LAB_0026bfef:
  if ((pSVar4 != (SupportVectorClassifier *)0x0) &&
     (0 < *(int *)&(pSVar4->numberofsupportvectorsperclass_).rep_)) {
    index = 0;
    do {
      pModel_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            ((RepeatedPtrFieldBase *)&pSVar4->numberofsupportvectorsperclass_,index)
      ;
      downgradeSpecificationVersion(pModel_00);
      index = index + 1;
    } while (index < *(int *)&(pSVar4->numberofsupportvectorsperclass_).rep_);
  }
  return;
}

Assistant:

void CoreML::downgradeSpecificationVersion(Specification::Model *pModel) {

    if (!pModel) { return; }


    if (pModel->specificationversion() == 0 || pModel->specificationversion() > MLMODEL_SPECIFICATION_VERSION_NEWEST) {
        // If mistakenly set specification verion or never set and left as default
        // lets start at the newest specification version and downgrade from there
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_NEWEST);
    }


    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14 && !hasIOS14Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS13 && !hasIOS13Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12 && !hasIOS12Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11_2);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2 && !hasIOS11_2Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11);
    }

    ::CoreML::Specification::Pipeline *pipeline = NULL;
    auto modelType = pModel->Type_case();
    if (modelType == Specification::Model::kPipeline) {
        pipeline = pModel->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineRegressor) {
        pipeline = pModel->mutable_pipelineregressor()->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineClassifier) {
        pipeline = pModel->mutable_pipelineclassifier()->mutable_pipeline();
    }

    if (pipeline) {
        for (int i=0; i< pipeline->models_size(); i++) {
            downgradeSpecificationVersion(pipeline->mutable_models(i));
        }
    }

}